

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesCMakeEnvironment(cmFindPackageCommand *this)

{
  mapped_type *this_00;
  size_t startIndex;
  string debugBuffer;
  string local_c8;
  cmAlphaNum local_a8;
  string local_78;
  cmAlphaNum local_58;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeEnvironment);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  cmSearchPath::AddEnvPath(this_00,&this->Variable);
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_a8.View_._M_len = 0xd;
    local_a8.View_._M_str = "Env variable ";
    local_58.View_._M_str = (this->Variable)._M_dataplus._M_p;
    local_58.View_._M_len = (this->Variable)._M_string_length;
    cmStrCat<char[43]>(&local_78,&local_a8,&local_58,(char (*) [43])0x636ef2);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    startIndex = anon_unknown.dwarf_d105b2::collectPathsForDebug(&local_c8,this_00,0);
  }
  else {
    startIndex = 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_PREFIX_PATH",(allocator<char> *)&local_58);
  cmSearchPath::AddEnvPath(this_00,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_a8.View_._M_len = local_c8._M_string_length;
    local_a8.View_._M_str = local_c8._M_dataplus._M_p;
    local_58.View_._M_len = 0x48;
    local_58.View_._M_str =
         "CMAKE_PREFIX_PATH env variable [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n";
    cmStrCat<>(&local_78,&local_a8,&local_58);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    startIndex = anon_unknown.dwarf_d105b2::collectPathsForDebug(&local_c8,this_00,startIndex);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_FRAMEWORK_PATH",(allocator<char> *)&local_58);
  cmSearchPath::AddEnvPath(this_00,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_APPBUNDLE_PATH",(allocator<char> *)&local_58);
  cmSearchPath::AddEnvPath(this_00,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_a8.View_._M_len = local_c8._M_string_length;
    local_a8.View_._M_str = local_c8._M_dataplus._M_p;
    local_58.View_._M_len = 0x65;
    local_58.View_._M_str =
         "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH env variables [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n"
    ;
    cmStrCat<>(&local_78,&local_a8,&local_58);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    anon_unknown.dwarf_d105b2::collectPathsForDebug(&local_c8,this_00,startIndex);
    local_a8.View_._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_a8.View_._M_len = (this->DebugBuffer)._M_string_length;
    local_58.View_._M_len = local_c8._M_string_length;
    local_58.View_._M_str = local_c8._M_dataplus._M_p;
    cmStrCat<>(&local_78,&local_a8,&local_58);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeEnvironment()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeEnvironment];
  std::string debugBuffer;
  std::size_t debugOffset = 0;

  // Check the environment variable with the same name as the cache
  // entry.
  paths.AddEnvPath(this->Variable);
  if (this->DebugMode) {
    debugBuffer = cmStrCat("Env variable ", this->Variable,
                           " [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    debugOffset = collectPathsForDebug(debugBuffer, paths);
  }

  // And now the general CMake environment variables
  paths.AddEnvPath("CMAKE_PREFIX_PATH");
  if (this->DebugMode) {
    debugBuffer = cmStrCat(debugBuffer,
                           "CMAKE_PREFIX_PATH env variable "
                           "[CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    debugOffset = collectPathsForDebug(debugBuffer, paths, debugOffset);
  }

  paths.AddEnvPath("CMAKE_FRAMEWORK_PATH");
  paths.AddEnvPath("CMAKE_APPBUNDLE_PATH");
  if (this->DebugMode) {
    debugBuffer =
      cmStrCat(debugBuffer,
               "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH env "
               "variables [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    collectPathsForDebug(debugBuffer, paths, debugOffset);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}